

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQuerySurfaceTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::SurfaceAttribPixmapCase::executeForConfig
          (SurfaceAttribPixmapCase *this,EGLDisplay display,EGLConfig config)

{
  deUint32 err;
  Library *egl_00;
  TestLog *this_00;
  NativeDisplayFactory *factory;
  CommandLine *cmdLine;
  MessageBuilder *pMVar1;
  NativeDisplay *pNVar2;
  undefined8 uVar3;
  NativePixmap *pixmap_00;
  EGLSurface pvVar4;
  undefined1 local_298 [8];
  UniqueSurface surface;
  undefined1 local_278 [8];
  UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> pixmap;
  MessageBuilder local_258;
  undefined1 local_d8 [8];
  ConfigInfo info;
  NativePixmapFactory *pixmapFactory;
  int height;
  int width;
  TestLog *log;
  Library *egl;
  EGLConfig config_local;
  EGLDisplay display_local;
  SurfaceAttribPixmapCase *this_local;
  
  egl_00 = EglTestContext::getLibrary
                     ((this->super_SurfaceAttribCase).super_SimpleConfigCase.super_TestCase.
                      m_eglTestCtx);
  this_00 = tcu::TestContext::getLog
                      ((this->super_SurfaceAttribCase).super_SimpleConfigCase.super_TestCase.
                       super_TestCase.super_TestNode.m_testCtx);
  factory = EglTestContext::getNativeDisplayFactory
                      ((this->super_SurfaceAttribCase).super_SimpleConfigCase.super_TestCase.
                       m_eglTestCtx);
  cmdLine = tcu::TestContext::getCommandLine
                      ((this->super_SurfaceAttribCase).super_SimpleConfigCase.super_TestCase.
                       super_TestCase.super_TestNode.m_testCtx);
  info._144_8_ = eglu::selectNativePixmapFactory(factory,cmdLine);
  eglu::ConfigInfo::ConfigInfo((ConfigInfo *)local_d8);
  eglu::queryCoreConfigInfo(egl_00,display,config,(ConfigInfo *)local_d8);
  tcu::TestLog::operator<<(&local_258,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<
                     (&local_258,(char (*) [40])"Creating pixmap surface with config ID ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(int *)&info.colorBufferType);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_258);
  err = (*egl_00->_vptr_Library[0x1f])();
  eglu::checkError(err,"before queries",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglQuerySurfaceTests.cpp"
                   ,0x269);
  uVar3 = info._144_8_;
  pNVar2 = EglTestContext::getNativeDisplay
                     ((this->super_SurfaceAttribCase).super_SimpleConfigCase.super_TestCase.
                      m_eglTestCtx);
  uVar3 = (**(code **)(*(long *)uVar3 + 0x20))(uVar3,pNVar2,display,config,0,0x40,0x40);
  de::DefaultDeleter<eglu::NativePixmap>::DefaultDeleter
            ((DefaultDeleter<eglu::NativePixmap> *)((long)&surface.m_surface + 7));
  de::details::UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>::UniquePtr
            ((UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *)local_278,
             uVar3);
  pNVar2 = EglTestContext::getNativeDisplay
                     ((this->super_SurfaceAttribCase).super_SimpleConfigCase.super_TestCase.
                      m_eglTestCtx);
  pixmap_00 = de::details::UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>::
              operator*((UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *)
                        local_278);
  pvVar4 = eglu::createPixmapSurface(pNVar2,pixmap_00,display,config,(EGLAttrib *)0x0);
  eglu::UniqueSurface::UniqueSurface((UniqueSurface *)local_298,egl_00,display,pvVar4);
  pvVar4 = eglu::UniqueSurface::operator*((UniqueSurface *)local_298);
  SurfaceAttribCase::testAttributes
            (&this->super_SurfaceAttribCase,display,pvVar4,2,(ConfigInfo *)local_d8);
  eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)local_298);
  de::details::UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>::~UniquePtr
            ((UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *)local_278);
  return;
}

Assistant:

void executeForConfig (EGLDisplay display, EGLConfig config)
	{
		const Library&						egl				= m_eglTestCtx.getLibrary();
		tcu::TestLog&						log				= m_testCtx.getLog();
		const int							width			= 64;
		const int							height			= 64;
		const eglu::NativePixmapFactory&	pixmapFactory	= eglu::selectNativePixmapFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());
		ConfigInfo							info;

		eglu::queryCoreConfigInfo(egl, display, config, &info);

		log << TestLog::Message << "Creating pixmap surface with config ID " << info.configId << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "before queries");

		de::UniquePtr<eglu::NativePixmap>	pixmap	(pixmapFactory.createPixmap(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, width, height));
		eglu::UniqueSurface					surface	(egl, display, eglu::createPixmapSurface(m_eglTestCtx.getNativeDisplay(), *pixmap, display, config, DE_NULL));

		testAttributes(display, *surface, EGL_PIXMAP_BIT, info);
	}